

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O2

QDataStream * __thiscall QDataStream::writeBytes(QDataStream *this,char *s,qint64 len)

{
  bool bVar1;
  
  if (len < 0) {
    this->q_status = '\x03';
  }
  else if ((this->dev != (QIODevice *)0x0) && (this->q_status == '\0')) {
    bVar1 = writeQSizeType(this,len);
    if ((len != 0) && (bVar1)) {
      writeRawData(this,s,len);
    }
  }
  return this;
}

Assistant:

QDataStream &QDataStream::writeBytes(const char *s, qint64 len)
{
    if (len < 0) {
        q_status = WriteFailed;
        return *this;
    }
    CHECK_STREAM_WRITE_PRECOND(*this)
    // Write length then, if any, content
    if (writeQSizeType(*this, len) && len > 0)
        writeRawData(s, len);
    return *this;
}